

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O0

Abc_Ntk_t * Acb_NtkToAbc(Abc_Ntk_t *pNtk,Acb_Ntk_t *p)

{
  Mem_Flex_t *pMan_00;
  int iVar1;
  Acb_ObjType_t AVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar5;
  word *pTruth;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pObjNew_1;
  Abc_Obj_t *pObjNew;
  Vec_Int_t *vCover;
  Mem_Flex_t *pMan;
  Abc_Ntk_t *pNtkNew;
  int iFanin;
  int iObj;
  int k;
  int i;
  Acb_Ntk_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pMan_00 = (Mem_Flex_t *)pNtk_local->pManFunc;
  p_00 = Vec_IntAlloc(1000);
  Acb_NtkCleanObjCopies(p);
  for (iObj = 0; iVar1 = Acb_NtkCiNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Acb_NtkCi(p,iObj);
    pAVar5 = Abc_NtkCi(pNtk_local,iObj);
    uVar3 = Abc_ObjId(pAVar5);
    Acb_ObjSetCopy(p,iVar1,uVar3);
  }
  for (pNtkNew._4_4_ = 1; iVar1 = Vec_StrSize(&p->vObjType), pNtkNew._4_4_ < iVar1;
      pNtkNew._4_4_ = pNtkNew._4_4_ + 1) {
    AVar2 = Acb_ObjType(p,pNtkNew._4_4_);
    if ((AVar2 != ABC_OPER_NONE) && (iVar1 = Acb_ObjIsCio(p,pNtkNew._4_4_), iVar1 == 0)) {
      pAVar5 = Abc_NtkCreateNode(pNtk_local);
      iVar1 = Acb_ObjFaninNum(p,pNtkNew._4_4_);
      pTruth = Acb_ObjTruthP(p,pNtkNew._4_4_);
      pcVar6 = Abc_SopCreateFromTruthIsop(pMan_00,iVar1,pTruth,p_00);
      (pAVar5->field_5).pData = pcVar6;
      uVar3 = Abc_ObjId(pAVar5);
      Acb_ObjSetCopy(p,pNtkNew._4_4_,uVar3);
    }
  }
  Vec_IntFree(p_00);
  pNtkNew._4_4_ = 1;
  do {
    iVar1 = Vec_StrSize(&p->vObjType);
    if (iVar1 <= pNtkNew._4_4_) {
      for (iObj = 0; iVar1 = Acb_NtkCoNum(p), iObj < iVar1; iObj = iObj + 1) {
        iVar1 = Acb_NtkCo(p,iObj);
        iVar1 = Acb_ObjFanin(p,iVar1,0);
        pAVar5 = Abc_NtkCo(pNtk_local,iObj);
        iVar1 = Acb_ObjCopy(p,iVar1);
        pAVar7 = Abc_NtkObj(pNtk_local,iVar1);
        Abc_ObjAddFanin(pAVar5,pAVar7);
      }
      iVar1 = Abc_NtkCheck(pNtk_local);
      if (iVar1 == 0) {
        printf("Acb_NtkToAbc: The network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      return pNtk_local;
    }
    AVar2 = Acb_ObjType(p,pNtkNew._4_4_);
    if ((AVar2 != ABC_OPER_NONE) && (iVar1 = Acb_ObjIsCio(p,pNtkNew._4_4_), iVar1 == 0)) {
      iVar1 = Acb_ObjCopy(p,pNtkNew._4_4_);
      pAVar5 = Abc_NtkObj(pNtk_local,iVar1);
      for (iFanin = 0; iVar1 = Acb_ObjFaninNum(p,pNtkNew._4_4_), iFanin < iVar1; iFanin = iFanin + 1
          ) {
        iVar1 = Acb_ObjFanin(p,pNtkNew._4_4_,iFanin);
        iVar1 = Acb_ObjCopy(p,iVar1);
        pAVar7 = Abc_NtkObj(pNtk_local,iVar1);
        Abc_ObjAddFanin(pAVar5,pAVar7);
      }
      iVar1 = Abc_SopGetVarNum((char *)(pAVar5->field_5).pData);
      iVar4 = Abc_ObjFaninNum(pAVar5);
      if (iVar1 != iVar4) {
        __assert_fail("Abc_SopGetVarNum((char *)pObjNew->pData) == Abc_ObjFaninNum(pObjNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbAbc.c"
                      ,0x8c,"Abc_Ntk_t *Acb_NtkToAbc(Abc_Ntk_t *, Acb_Ntk_t *)");
      }
    }
    pNtkNew._4_4_ = pNtkNew._4_4_ + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Acb_NtkToAbc( Abc_Ntk_t * pNtk, Acb_Ntk_t * p )
{
    int i, k, iObj, iFanin;
    Abc_Ntk_t * pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    Mem_Flex_t * pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    Vec_Int_t * vCover = Vec_IntAlloc( 1000 );
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Abc_ObjId(Abc_NtkCi(pNtkNew, i)) );
    Acb_NtkForEachNode( p, iObj )
    {
        Abc_Obj_t * pObjNew = Abc_NtkCreateNode( pNtkNew );
        pObjNew->pData = Abc_SopCreateFromTruthIsop( pMan, Acb_ObjFaninNum(p, iObj), Acb_ObjTruthP(p, iObj), vCover );
        Acb_ObjSetCopy( p, iObj, Abc_ObjId(pObjNew) );
    }
    Vec_IntFree( vCover );
    Acb_NtkForEachNode( p, iObj )
    {
        Abc_Obj_t * pObjNew = Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iObj));
        Acb_ObjForEachFanin( p, iObj, iFanin, k )
            Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iFanin)) );
        assert( Abc_SopGetVarNum((char *)pObjNew->pData) == Abc_ObjFaninNum(pObjNew) );
    }
    Acb_NtkForEachCoDriver( p, iFanin, i )
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iFanin)) );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Acb_NtkToAbc: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}